

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::InvalidateSubFboUnbindReadCase::compare
          (InvalidateSubFboUnbindReadCase *this,Surface *reference,Surface *result)

{
  bool bVar1;
  TestLog *log;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  RGBA local_2c;
  RGBA local_28;
  RGBA local_24;
  Surface *pSStack_20;
  RGBA threshold;
  Surface *result_local;
  Surface *reference_local;
  InvalidateSubFboUnbindReadCase *this_local;
  
  pSStack_20 = result;
  local_28 = FboTestUtil::getFormatThreshold(this->m_colorFmt);
  tcu::RGBA::RGBA(&local_2c,0xc,0xc,0xc,0xc);
  local_24 = tcu::max(local_28,local_2c);
  log = tcu::TestContext::getLog
                  ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::Surface::getAccess(&local_58,reference);
  tcu::Surface::getAccess(&local_80,pSStack_20);
  bVar1 = tcu::bilinearCompare
                    (log,"Result","Image comparison result",&local_58,&local_80,local_24,
                     COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool compare (const tcu::Surface& reference, const tcu::Surface& result)
	{
		const tcu::RGBA threshold (tcu::max(getFormatThreshold(m_colorFmt), tcu::RGBA(12, 12, 12, 12)));

		return tcu::bilinearCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference.getAccess(), result.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);
	}